

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O1

void __thiscall Fir1::Fir1(Fir1 *this,char *coeffFile,uint number_of_taps)

{
  int iVar1;
  FILE *__stream;
  invalid_argument *this_00;
  uint i;
  uint uVar2;
  vector<double,_std::allocator<double>_> tmpCoefficients;
  double v;
  vector<double,_std::allocator<double>_> local_78;
  double local_58;
  Fir1 *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  this->offset = 0;
  this->mu = 0.0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_50 = this;
  __stream = fopen(coeffFile,"rt");
  if (__stream == (FILE *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Could not open file.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar2 = 0;
  do {
    local_58 = 0.0;
    iVar1 = __isoc99_fscanf(__stream,"%lf\n",&local_58);
    if (iVar1 < 1) break;
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_78,
                 (iterator)
                 local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_58);
    }
    else {
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_58;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 <= number_of_taps - 1);
  fclose(__stream);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,&local_78);
  initWithVector(local_50,&local_48);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Fir1::Fir1(const char* coeffFile, unsigned number_of_taps) {

	std::vector<double> tmpCoefficients;

	FILE* f=fopen(coeffFile,"rt");
	if (!f) {
		throw std::invalid_argument("Could not open file.");
	}
	for(unsigned int i=0;(i<number_of_taps)||(number_of_taps==0);i++) {
		double v = 0;
		int r = fscanf(f,"%lf\n",&v);
		if (r < 1) break;
		tmpCoefficients.push_back(v);
	}
	fclose(f);
	initWithVector(tmpCoefficients);
}